

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float fVar1;
  ImGuiNextWindowDataFlags IVar2;
  ImGuiWindow *this;
  ImVec2 pos;
  ImVec2 IVar3;
  ImGuiContext_conflict1 *pIVar4;
  uint flags_00;
  char *text;
  bool bVar5;
  ImGuiID id;
  ImGuiID id_00;
  ImU32 IVar6;
  ImU32 col;
  ImGuiContext *g;
  ImDrawFlags IVar7;
  char *text_00;
  uint uVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar9;
  float fVar10;
  bool hovered;
  ImRect bb;
  bool held;
  ImRect total_bb;
  bool local_c6;
  bool local_c5;
  float local_c4;
  ImRect local_c0;
  bool local_a9;
  undefined1 local_a8 [16];
  ImGuiNextWindowDataFlags local_94;
  float local_90;
  uint local_8c;
  char *local_88;
  ImVec2 local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  char *local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  
  pIVar4 = GImGui;
  this = (ImGuiWindow *)GImGui->CurrentWindow;
  this->WriteAccessed = true;
  IVar2 = (pIVar4->NextWindowData).Flags;
  (pIVar4->NextWindowData).Flags = 0;
  if (this->SkipItems == false) {
    local_58 = preview_value;
    id = ImGuiWindow::GetID(this,label,(char *)0x0);
    if ((~flags & 0x60U) == 0) {
      __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                    ,0x62a,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
    }
    local_c4 = 0.0;
    if ((flags & 0x20U) == 0) {
      local_c4 = GetFrameHeight();
    }
    IVar3 = CalcTextSize(label,(char *)0x0,true,-1.0);
    local_68._8_4_ = extraout_XMM0_Dc;
    local_68._0_4_ = IVar3.x;
    local_68._4_4_ = IVar3.y;
    local_68._12_4_ = extraout_XMM0_Dd;
    local_90 = local_c4;
    if ((flags & 0x40U) == 0) {
      local_90 = CalcItemWidth();
    }
    fVar1 = (pIVar4->Style).FramePadding.y;
    local_c0.Max.x = (this->DC).CursorPos.x + local_90;
    fVar9 = fVar1 + fVar1 + (float)local_68._4_4_ + (this->DC).CursorPos.y;
    local_c0.Max.y = fVar9;
    local_c0.Min = (this->DC).CursorPos;
    fVar10 = 0.0;
    if (0.0 < (float)local_68._0_4_) {
      fVar10 = (pIVar4->Style).ItemInnerSpacing.x + (float)local_68._0_4_;
    }
    local_40.Max.y = fVar9 + 0.0;
    local_40.Max.x = fVar10 + local_c0.Max.x;
    local_94 = IVar2;
    local_8c = flags;
    local_88 = label;
    local_40.Min = local_c0.Min;
    ItemSize(&local_40,fVar1);
    bVar5 = ItemAdd(&local_40,id,&local_c0,0);
    if (!bVar5) {
      return false;
    }
    bVar5 = ButtonBehavior(&local_c0,id,&local_c5,&local_a9,0);
    id_00 = ImHashStr("##ComboPopup",0,id);
    local_c6 = IsPopupOpen(id_00,0);
    flags_00 = local_8c;
    if ((!local_c6) && (bVar5)) {
      OpenPopupEx(id_00,0);
      local_c6 = true;
    }
    IVar6 = GetColorU32(local_c5 + 7,1.0);
    local_a8 = ZEXT416((uint)local_c0.Min.x);
    local_78 = ZEXT416((uint)local_c0.Max.x);
    RenderNavHighlight(&local_c0,id,1);
    uVar8 = -(uint)((float)local_78._0_4_ - local_c4 <= (float)local_a8._0_4_);
    local_a8._0_4_ = uVar8 & local_a8._0_4_ | ~uVar8 & (uint)((float)local_78._0_4_ - local_c4);
    local_a8._4_4_ = local_78._4_4_ & local_a8._4_4_;
    local_a8._8_4_ = local_78._8_4_ & local_a8._8_4_;
    local_a8._12_4_ = local_78._12_4_ & local_a8._12_4_;
    if ((flags_00 & 0x40) == 0) {
      local_80.y = local_c0.Max.y;
      local_80.x = (float)local_a8._0_4_;
      IVar7 = 0xf0;
      if ((flags_00 & 0x20) == 0) {
        IVar7 = 0x50;
      }
      ImDrawList::AddRectFilled
                (this->DrawList,&local_c0.Min,&local_80,IVar6,(pIVar4->Style).FrameRounding,IVar7);
    }
    local_78._0_4_ = id_00;
    if ((flags_00 & 0x20) == 0) {
      IVar6 = GetColorU32(((byte)(local_c5 | local_c6) & 1) + 0x15,1.0);
      col = GetColorU32(0,1.0);
      local_80.y = local_c0.Min.y;
      local_80.x = (float)local_a8._0_4_;
      IVar7 = 0xa0;
      if (local_90 <= local_c4) {
        IVar7 = 0xf0;
      }
      ImDrawList::AddRectFilled
                (this->DrawList,&local_80,&local_c0.Max,IVar6,(pIVar4->Style).FrameRounding,IVar7);
      if ((local_c4 + (float)local_a8._0_4_) - (pIVar4->Style).FramePadding.x <= local_c0.Max.x) {
        fVar1 = (pIVar4->Style).FramePadding.y;
        IVar3.y = fVar1 + local_c0.Min.y;
        IVar3.x = (float)local_a8._0_4_ + fVar1;
        RenderArrow(this->DrawList,IVar3,col,3,1.0);
      }
    }
    RenderFrameBorder(local_c0.Min,local_c0.Max,(pIVar4->Style).FrameRounding);
    text = local_88;
    text_00 = local_58;
    if ((flags_00 >> 0x14 & 1) != 0) {
      (pIVar4->ComboPreviewData).PreviewRect.Min = local_c0.Min;
      (pIVar4->ComboPreviewData).PreviewRect.Max.x = (float)local_a8._0_4_;
      (pIVar4->ComboPreviewData).PreviewRect.Max.y = local_c0.Max.y;
      if ((local_58 != (char *)0x0) && (*local_58 != '\0')) {
        __assert_fail("preview_value == __null || preview_value[0] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                      ,0x654,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
      }
      text_00 = (char *)0x0;
    }
    if (text_00 != (char *)0x0 && (char)((flags_00 & 0x40) >> 6) == '\0') {
      if (pIVar4->LogEnabled == true) {
        LogSetNextTextDecoration("{","}");
      }
      local_80.y = local_c0.Min.y + (pIVar4->Style).FramePadding.y;
      local_80.x = local_c0.Min.x + (pIVar4->Style).FramePadding.x;
      local_48.x = (float)local_a8._0_4_;
      local_48.y = local_c0.Max.y;
      local_50.x = 0.0;
      local_50.y = 0.0;
      RenderTextClipped(&local_80,&local_48,text_00,(char *)0x0,(ImVec2 *)0x0,&local_50,
                        (ImRect *)0x0);
    }
    if (0.0 < (float)local_68._0_4_) {
      pos.y = local_c0.Min.y + (pIVar4->Style).FramePadding.y;
      pos.x = local_c0.Max.x + (pIVar4->Style).ItemInnerSpacing.x;
      RenderText(pos,text,(char *)0x0,true);
    }
    if (local_c6 != false) {
      (pIVar4->NextWindowData).Flags = local_94;
      bVar5 = BeginComboPopup(local_78._0_4_,&local_c0,flags_00);
      return bVar5;
    }
  }
  return false;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    ImGuiNextWindowDataFlags backup_next_window_data_flags = g.NextWindowData.Flags;
    g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);
    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : CalcItemWidth();
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(bb.Min, bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &bb))
        return false;

    // Open on click
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);
    const ImGuiID popup_id = ImHashStr("##ComboPopup", 0, id);
    bool popup_open = IsPopupOpen(popup_id, ImGuiPopupFlags_None);
    if (pressed && !popup_open)
    {
        OpenPopupEx(popup_id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    // Render shape
    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(bb.Min.x, bb.Max.x - arrow_size);
    RenderNavHighlight(bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(bb.Min, ImVec2(value_x2, bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersLeft);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, bb.Min.y), bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawFlags_RoundCornersAll : ImDrawFlags_RoundCornersRight);
        if (value_x2 + arrow_size - style.FramePadding.x <= bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(bb.Min, bb.Max, style.FrameRounding);

    // Custom preview
    if (flags & ImGuiComboFlags_CustomPreview)
    {
        g.ComboPreviewData.PreviewRect = ImRect(bb.Min.x, bb.Min.y, value_x2, bb.Max.y);
        IM_ASSERT(preview_value == NULL || preview_value[0] == 0);
        preview_value = NULL;
    }

    // Render preview and label
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(bb.Min + style.FramePadding, ImVec2(value_x2, bb.Max.y), preview_value, NULL, NULL);
    }
    if (label_size.x > 0)
        RenderText(ImVec2(bb.Max.x + style.ItemInnerSpacing.x, bb.Min.y + style.FramePadding.y), label);

    if (!popup_open)
        return false;

    g.NextWindowData.Flags = backup_next_window_data_flags;
    return BeginComboPopup(popup_id, bb, flags);
}